

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::GrowNoAnnotate
          (RepeatedField<google::protobuf::UnknownField> *this,bool was_soo,int old_size,
          int new_size)

{
  Arena *this_00;
  HeapRep *pHVar1;
  undefined8 *puVar2;
  UnknownField *__src;
  LogMessage *this_01;
  Nonnull<const_char_*> pcVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  string_view str;
  int local_4c;
  LogMessage local_48;
  undefined8 *local_38;
  
  pcVar3 = (Nonnull<const_char_*>)0x0;
  iVar6 = 0;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar6 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (new_size <= iVar6) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)new_size,(long)iVar6,"new_size > old_capacity");
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ad,pcVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_00 = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    pHVar1 = heap_rep(this);
    this_00 = (pHVar1->field_0).arena;
  }
  if (new_size < 1) {
    new_size = 1;
  }
  else if (iVar6 < 0x3ffffff8) {
    if (iVar6 < 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x493,"capacity == 0 || capacity >= lower_limit");
      local_4c = iVar6;
      this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                          (&local_48,&local_4c);
      str._M_str = " ";
      str._M_len = 1;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_01,str);
      local_4c = 1;
      absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_01,&local_4c);
      goto LAB_0024b101;
    }
    iVar6 = iVar6 * 2 + 1;
    if (new_size < iVar6) {
      new_size = iVar6;
    }
  }
  else {
    new_size = 0x7fffffff;
  }
  uVar4 = (ulong)new_size;
  uVar5 = uVar4 * 0x10;
  if (this_00 == (Arena *)0x0) {
    if ((uVar4 & 0xfffffff80000000) == 0) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (uVar4 & 0xfffffffffffffff,0x7fffffff,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4bc,pcVar3);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_48,
                 (char (*) [59])"Requested size is too large to fit element count into int.");
LAB_0024b101:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
      puVar2 = (undefined8 *)operator_new(uVar5 + 0x10);
    }
    else {
      auVar7 = (**(code **)(in_FS_OFFSET + -0x48))
                         (uVar5 + 0x10,*(undefined8 *)(in_FS_OFFSET + -0x40));
      puVar2 = auVar7._0_8_;
      uVar5 = auVar7._8_8_ - 0x10;
    }
    uVar5 = uVar5 >> 4;
    if (0x7ffffffe < uVar5) {
      uVar5 = 0x7fffffff;
    }
    new_size = (int)uVar5;
  }
  else {
    puVar2 = (undefined8 *)Arena::AllocateForArray(this_00,uVar5 + 0x10);
  }
  *puVar2 = this_00;
  if (0 < old_size) {
    local_38 = puVar2 + 2;
    __src = elements(this,was_soo);
    memcpy(local_38,__src,(ulong)(uint)old_size << 4);
  }
  if (!was_soo) {
    InternalDeallocate<false>(this);
  }
  internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,new_size,puVar2 + 2);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}